

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlRule.h
# Opt level: O2

void __thiscall GdlRule::GdlRule(GdlRule *this)

{
  GdlObject::GdlObject(&this->super_GdlObject);
  (this->m_vfOptRangeContext).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->m_vfOptRangeContext).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->m_vprit).super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vprit).super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vprit).super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vpexpConstraints).super__Vector_base<GdlExpression_*,_std::allocator<GdlExpression_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vpexpConstraints).super__Vector_base<GdlExpression_*,_std::allocator<GdlExpression_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vpexpConstraints).super__Vector_base<GdlExpression_*,_std::allocator<GdlExpression_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vpalias).super__Vector_base<GdlAlias_*,_std::allocator<GdlAlias_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vpalias).super__Vector_base<GdlAlias_*,_std::allocator<GdlAlias_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vpalias).super__Vector_base<GdlAlias_*,_std::allocator<GdlAlias_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vfOptRangeContext).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->m_vfOptRangeContext).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  (this->m_vfOptRangeContext).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  (this->m_viritOptRangeStart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_viritOptRangeStart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_viritOptRangeStart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_viritOptRangeEnd).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_viritOptRangeEnd).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_viritOptRangeEnd).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_viritInput).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->m_viritInput).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->m_viritInput).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->m_viritOutput).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_viritOutput).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_viritOutput).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->m_nScanAdvance = -1;
  this->m_nDefaultAdvance = -1;
  this->m_fBadRule = false;
  this->m_fAutoAssoc = false;
  return;
}

Assistant:

GdlRule()
	{
		m_nScanAdvance = -1;
		m_nDefaultAdvance = -1;
		m_fBadRule = false;
		m_fAutoAssoc = false;
	}